

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibReader.cpp
# Opt level: O2

void __thiscall ZlibReader::~ZlibReader(ZlibReader *this)

{
  ~ZlibReader(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

ZlibReader::~ZlibReader()
{
	inflateEnd(&z);
}